

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe50At4(uint8_t *buf)

{
  return (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 0xf) << 0x10) << 0x1e |
         (ulong)((uint)buf[4] << 0xe | (uint)buf[3] << 0x16) | (ulong)buf[5] << 6 |
         (ulong)(buf[6] >> 2);
}

Assistant:

std::uint64_t readFlUIntBe50At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 6;
    res |= (buf[6] >> 2);
    res &= UINT64_C(0x3ffffffffffff);
    return res;
}